

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spinlock.cc
# Opt level: O0

void __thiscall absl::lts_20250127::base_internal::SpinLock::SlowLock(SpinLock *this)

{
  uint lock_value_00;
  int64_t wait_start_time_00;
  int64_t wait_end_time;
  int local_50;
  uint32_t local_4c;
  int lock_wait_call_count;
  uint32_t wait_cycles;
  int64_t wait_start_time;
  SchedulingMode scheduling_mode;
  uint32_t lock_value;
  SpinLock *this_local;
  uint local_28;
  undefined4 local_24;
  undefined4 local_20;
  uint local_1c;
  long local_18;
  SpinLock *local_10;
  
  _scheduling_mode = this;
  wait_start_time._4_4_ = SpinLoop(this);
  wait_start_time._4_4_ = TryLockInternal(this,wait_start_time._4_4_,0);
  if ((wait_start_time._4_4_ & 1) != 0) {
    wait_start_time._0_4_ = (SchedulingMode)((wait_start_time._4_4_ & 2) != 0);
    wait_start_time_00 = CycleClock::Now();
    local_4c = 0;
    local_50 = 0;
    while ((wait_start_time._4_4_ & 1) != 0) {
      if ((wait_start_time._4_4_ & 0xfffffff8) == 0) {
        local_28 = wait_start_time._4_4_ | 8;
        local_18 = (long)&wait_start_time + 4;
        local_20 = 0;
        local_24 = 0;
        LOCK();
        lock_value_00 = (this->lockword_).super___atomic_base<unsigned_int>._M_i;
        this_local._7_1_ = wait_start_time._4_4_ == lock_value_00;
        if ((bool)this_local._7_1_) {
          (this->lockword_).super___atomic_base<unsigned_int>._M_i = local_28;
          lock_value_00 = wait_start_time._4_4_;
        }
        UNLOCK();
        local_1c = local_28;
        local_10 = this;
        if ((bool)this_local._7_1_) {
          wait_start_time._4_4_ = wait_start_time._4_4_ | 8;
          goto LAB_006e18c2;
        }
        wait_start_time._4_4_ = lock_value_00;
        if ((lock_value_00 & 1) == 0) {
          wait_start_time._4_4_ = TryLockInternal(this,lock_value_00,local_4c);
        }
        else if ((lock_value_00 & 0xfffffff8) != 0) goto LAB_006e18c2;
      }
      else {
LAB_006e18c2:
        local_50 = local_50 + 1;
        SpinLockDelay(&this->lockword_,wait_start_time._4_4_,local_50,
                      (SchedulingMode)wait_start_time);
        wait_start_time._4_4_ = SpinLoop(this);
        wait_end_time = CycleClock::Now();
        local_4c = EncodeWaitCycles(wait_start_time_00,wait_end_time);
        wait_start_time._4_4_ = TryLockInternal(this,wait_start_time._4_4_,local_4c);
      }
    }
  }
  return;
}

Assistant:

void SpinLock::SlowLock() {
  uint32_t lock_value = SpinLoop();
  lock_value = TryLockInternal(lock_value, 0);
  if ((lock_value & kSpinLockHeld) == 0) {
    return;
  }

  base_internal::SchedulingMode scheduling_mode;
  if ((lock_value & kSpinLockCooperative) != 0) {
    scheduling_mode = base_internal::SCHEDULE_COOPERATIVE_AND_KERNEL;
  } else {
    scheduling_mode = base_internal::SCHEDULE_KERNEL_ONLY;
  }

  // The lock was not obtained initially, so this thread needs to wait for
  // it.  Record the current timestamp in the local variable wait_start_time
  // so the total wait time can be stored in the lockword once this thread
  // obtains the lock.
  int64_t wait_start_time = CycleClock::Now();
  uint32_t wait_cycles = 0;
  int lock_wait_call_count = 0;
  while ((lock_value & kSpinLockHeld) != 0) {
    // If the lock is currently held, but not marked as having a sleeper, mark
    // it as having a sleeper.
    if ((lock_value & kWaitTimeMask) == 0) {
      // Here, just "mark" that the thread is going to sleep.  Don't store the
      // lock wait time in the lock -- the lock word stores the amount of time
      // that the current holder waited before acquiring the lock, not the wait
      // time of any thread currently waiting to acquire it.
      if (lockword_.compare_exchange_strong(
              lock_value, lock_value | kSpinLockSleeper,
              std::memory_order_relaxed, std::memory_order_relaxed)) {
        // Successfully transitioned to kSpinLockSleeper.  Pass
        // kSpinLockSleeper to the SpinLockWait routine to properly indicate
        // the last lock_value observed.
        lock_value |= kSpinLockSleeper;
      } else if ((lock_value & kSpinLockHeld) == 0) {
        // Lock is free again, so try and acquire it before sleeping.  The
        // new lock state will be the number of cycles this thread waited if
        // this thread obtains the lock.
        lock_value = TryLockInternal(lock_value, wait_cycles);
        continue;   // Skip the delay at the end of the loop.
      } else if ((lock_value & kWaitTimeMask) == 0) {
        // The lock is still held, without a waiter being marked, but something
        // else about the lock word changed, causing our CAS to fail. For
        // example, a new lock holder may have acquired the lock with
        // kSpinLockDisabledScheduling set, whereas the previous holder had not
        // set that flag. In this case, attempt again to mark ourselves as a
        // waiter.
        continue;
      }
    }

    // SpinLockDelay() calls into fiber scheduler, we need to see
    // synchronization there to avoid false positives.
    ABSL_TSAN_MUTEX_PRE_DIVERT(this, 0);
    // Wait for an OS specific delay.
    base_internal::SpinLockDelay(&lockword_, lock_value, ++lock_wait_call_count,
                                 scheduling_mode);
    ABSL_TSAN_MUTEX_POST_DIVERT(this, 0);
    // Spin again after returning from the wait routine to give this thread
    // some chance of obtaining the lock.
    lock_value = SpinLoop();
    wait_cycles = EncodeWaitCycles(wait_start_time, CycleClock::Now());
    lock_value = TryLockInternal(lock_value, wait_cycles);
  }
}